

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O2

void Hacl_Bignum64_bn_to_bytes_le(uint32_t len,uint64_t *b,uint8_t *res)

{
  long lVar1;
  uint8_t *__dest;
  ulong uVar2;
  void *__s;
  undefined8 uStack_40;
  uint8_t *local_38;
  
  uVar2 = (ulong)((len - 1 & 0xfffffff8) + 8);
  lVar1 = -(uVar2 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar1);
  local_38 = res;
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x17c275;
  memset(__s,0,uVar2);
  for (uVar2 = 0; __dest = local_38, (len - 1 >> 3) + 1 != uVar2; uVar2 = uVar2 + 1) {
    *(uint64_t *)((long)__s + uVar2 * 8) = b[uVar2];
  }
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x17c299;
  memcpy(__dest,__s,(ulong)len);
  return;
}

Assistant:

void Hacl_Bignum64_bn_to_bytes_le(uint32_t len, uint64_t *b, uint8_t *res)
{
  uint32_t bnLen = (len - 1U) / 8U + 1U;
  uint32_t tmpLen = 8U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < bnLen; i++)
  {
    store64_le(tmp + i * 8U, b[i]);
  }
  memcpy(res, tmp, len * sizeof (uint8_t));
}